

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_size(kvtree *hash)

{
  int iVar1;
  kvtree_elem_struct *pkVar2;
  
  iVar1 = 0;
  if ((hash != (kvtree *)0x0) &&
     (pkVar2 = hash->lh_first, iVar1 = 0, pkVar2 != (kvtree_elem_struct *)0x0)) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      pkVar2 = (pkVar2->pointers).le_next;
    } while (pkVar2 != (kvtree_elem_struct *)0x0);
  }
  return iVar1;
}

Assistant:

int kvtree_size(const kvtree* hash)
{
  int count = 0;
  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      count++;
    }
  }
  return count;
}